

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_ssi_filter_module.c
# Opt level: O0

ngx_int_t ngx_http_ssi_evaluate_string
                    (ngx_http_request_t *r,ngx_http_ssi_ctx_t *ctx,ngx_str_t *text,ngx_uint_t flags)

{
  u_char uVar1;
  byte bVar2;
  bool bVar3;
  ngx_uint_t nVar4;
  ngx_int_t nVar5;
  size_t sVar6;
  ngx_str_t *pnVar7;
  ngx_http_variable_value_t *pnVar8;
  undefined8 *puVar9;
  u_char *__dest;
  ngx_http_variable_value_t *vv;
  ngx_array_t values;
  ngx_array_t lengths;
  ngx_uint_t quoted;
  ngx_uint_t bracket;
  ngx_uint_t n;
  ngx_uint_t i;
  ngx_int_t key;
  ngx_str_t *val;
  ngx_str_t var;
  size_t part_len;
  size_t prefix;
  size_t len;
  size_t *size;
  u_char *part_data;
  u_char *data;
  u_char **value;
  u_char *p;
  u_char ch;
  ngx_uint_t flags_local;
  ngx_str_t *text_local;
  ngx_http_ssi_ctx_t *ctx_local;
  ngx_http_request_t *r_local;
  
  nVar4 = ngx_http_script_variables_count(text);
  if (nVar4 == 0) {
    part_data = text->data;
    value = (u_char **)part_data;
    if (((flags & 1) != 0) && (*text->data != '/')) {
      for (part_len = (r->uri).len; (part_len != 0 && ((r->uri).data[part_len - 1] != '/'));
          part_len = part_len - 1) {
      }
      if (part_len != 0) {
        part_data = (u_char *)ngx_pnalloc(r->pool,part_len + text->len);
        if (part_data == (u_char *)0x0) {
          return -1;
        }
        memcpy(part_data,(r->uri).data,part_len);
        value = (u_char **)(part_data + part_len);
      }
    }
    bVar3 = false;
    for (n = 0; n < text->len; n = n + 1) {
      uVar1 = text->data[n];
      if (bVar3) {
        bVar3 = false;
        if ((((uVar1 != '\\') && (uVar1 != '\'')) && (uVar1 != '\"')) && (uVar1 != '$')) {
          *(undefined1 *)value = 0x5c;
          value = (u_char **)((long)value + 1);
        }
LAB_0019d16a:
        *(u_char *)value = uVar1;
        value = (u_char **)((long)value + 1);
      }
      else {
        if (uVar1 != '\\') goto LAB_0019d16a;
        bVar3 = true;
      }
    }
    text->len = (long)value - (long)part_data;
    text->data = part_data;
    r_local = (ngx_http_request_t *)0x0;
  }
  else {
    nVar5 = ngx_array_init((ngx_array_t *)&values.pool,r->pool,8,8);
    if (nVar5 == 0) {
      nVar5 = ngx_array_init((ngx_array_t *)&vv,r->pool,8,8);
      if (nVar5 == 0) {
        prefix = 0;
        n = 0;
        while (n < text->len) {
          if (text->data[n] != '$') {
            size = (size_t *)(text->data + n);
            bVar3 = false;
            value = (u_char **)size;
            for (; n < text->len; n = n + 1) {
              uVar1 = text->data[n];
              if (bVar3) {
                bVar3 = false;
                if ((((uVar1 != '\\') && (uVar1 != '\'')) && (uVar1 != '\"')) && (uVar1 != '$')) {
                  *(undefined1 *)value = 0x5c;
                  value = (u_char **)((long)value + 1);
                }
LAB_0019d5aa:
                *(u_char *)value = uVar1;
                value = (u_char **)((long)value + 1);
              }
              else {
                if (uVar1 != '\\') {
                  if (uVar1 != '$') goto LAB_0019d5aa;
                  break;
                }
                bVar3 = true;
              }
            }
            var.data = (u_char *)((long)value - (long)size);
            goto LAB_0019d5e4;
          }
          val = (ngx_str_t *)0x0;
          sVar6 = n + 1;
          if (sVar6 == text->len) {
LAB_0019d844:
            if (3 < r->connection->log->log_level) {
              ngx_log_error_core(4,r->connection->log,0,"invalid variable name in \"%V\"",text);
            }
            r_local = (ngx_http_request_t *)&DAT_00000001;
            return (ngx_int_t)r_local;
          }
          if (text->data[sVar6] == '{') {
            bVar3 = true;
            n = n + 2;
            if (n == text->len) goto LAB_0019d844;
            var.len = (size_t)(text->data + n);
          }
          else {
            bVar3 = false;
            var.len = (size_t)(text->data + sVar6);
            n = sVar6;
          }
          for (; n < text->len; n = n + 1) {
            bVar2 = text->data[n];
            if ((bVar2 == 0x7d) && (bVar3)) {
              n = n + 1;
              bVar3 = false;
              break;
            }
            if ((((bVar2 < 0x41) || (0x5a < bVar2)) && ((bVar2 < 0x61 || (0x7a < bVar2)))) &&
               (((bVar2 < 0x30 || (0x39 < bVar2)) && (bVar2 != 0x5f)))) break;
            val = (ngx_str_t *)((long)&val->len + 1);
          }
          if (bVar3) {
            if (3 < r->connection->log->log_level) {
              ngx_log_error_core(4,r->connection->log,0,
                                 "the closing bracket in \"%V\" variable is missing",&val);
            }
            r_local = (ngx_http_request_t *)&DAT_00000001;
            return (ngx_int_t)r_local;
          }
          if (val == (ngx_str_t *)0x0) goto LAB_0019d844;
          nVar4 = ngx_hash_strlow((u_char *)var.len,(u_char *)var.len,(size_t)val);
          pnVar7 = ngx_http_ssi_get_variable(r,(ngx_str_t *)&val,nVar4);
          if (pnVar7 != (ngx_str_t *)0x0) {
            size = (size_t *)pnVar7->data;
            var.data = (u_char *)pnVar7->len;
            goto LAB_0019d5e4;
          }
          pnVar8 = ngx_http_get_variable(r,(ngx_str_t *)&val,nVar4);
          if (pnVar8 == (ngx_http_variable_value_t *)0x0) {
            return -1;
          }
          if ((*(uint *)pnVar8 >> 0x1e & 1) == 0) {
            size = (size_t *)pnVar8->data;
            var.data = (u_char *)(ulong)(*(uint *)pnVar8 & 0xfffffff);
LAB_0019d5e4:
            prefix = (size_t)(var.data + prefix);
            puVar9 = (undefined8 *)ngx_array_push((ngx_array_t *)&values.pool);
            if (puVar9 == (undefined8 *)0x0) {
              return -1;
            }
            *puVar9 = var.data;
            puVar9 = (undefined8 *)ngx_array_push((ngx_array_t *)&vv);
            if (puVar9 == (undefined8 *)0x0) {
              return -1;
            }
            *puVar9 = size;
          }
        }
        part_len = 0;
        if ((flags & 1) != 0) {
          for (n = 0; n < values.elts; n = n + 1) {
            if ((&((values.pool)->d).last)[n] != (u_char *)0x0) {
              if (**(char **)(&vv->field_0x0 + n * 8) != '/') {
                part_len = (r->uri).len;
                goto LAB_0019d6da;
              }
              break;
            }
          }
        }
LAB_0019d73a:
        __dest = (u_char *)ngx_pnalloc(r->pool,prefix + (long)(int)(uint)((flags & 2) != 0));
        if (__dest == (u_char *)0x0) {
          r_local = (ngx_http_request_t *)0xffffffffffffffff;
        }
        else {
          text->len = prefix;
          text->data = __dest;
          memcpy(__dest,(r->uri).data,part_len);
          value = (u_char **)(__dest + part_len);
          for (n = 0; n < values.elts; n = n + 1) {
            memcpy(value,*(void **)(&vv->field_0x0 + n * 8),(size_t)(&((values.pool)->d).last)[n]);
            value = (u_char **)((long)value + (long)(&((values.pool)->d).last)[n]);
          }
          r_local = (ngx_http_request_t *)0x0;
        }
      }
      else {
        r_local = (ngx_http_request_t *)0xffffffffffffffff;
      }
    }
    else {
      r_local = (ngx_http_request_t *)0xffffffffffffffff;
    }
  }
  return (ngx_int_t)r_local;
LAB_0019d6da:
  if (part_len == 0) goto LAB_0019d73a;
  if ((r->uri).data[part_len - 1] == '/') {
    prefix = part_len + prefix;
    goto LAB_0019d73a;
  }
  part_len = part_len - 1;
  goto LAB_0019d6da;
}

Assistant:

static ngx_int_t
ngx_http_ssi_evaluate_string(ngx_http_request_t *r, ngx_http_ssi_ctx_t *ctx,
    ngx_str_t *text, ngx_uint_t flags)
{
    u_char                      ch, *p, **value, *data, *part_data;
    size_t                     *size, len, prefix, part_len;
    ngx_str_t                   var, *val;
    ngx_int_t                   key;
    ngx_uint_t                  i, n, bracket, quoted;
    ngx_array_t                 lengths, values;
    ngx_http_variable_value_t  *vv;

    n = ngx_http_script_variables_count(text);

    if (n == 0) {

        data = text->data;
        p = data;

        if ((flags & NGX_HTTP_SSI_ADD_PREFIX) && text->data[0] != '/') {

            for (prefix = r->uri.len; prefix; prefix--) {
                if (r->uri.data[prefix - 1] == '/') {
                    break;
                }
            }

            if (prefix) {
                len = prefix + text->len;

                data = ngx_pnalloc(r->pool, len);
                if (data == NULL) {
                    return NGX_ERROR;
                }

                p = ngx_copy(data, r->uri.data, prefix);
            }
        }

        quoted = 0;

        for (i = 0; i < text->len; i++) {
            ch = text->data[i];

            if (!quoted) {

                if (ch == '\\') {
                    quoted = 1;
                    continue;
                }

            } else {
                quoted = 0;

                if (ch != '\\' && ch != '\'' && ch != '"' && ch != '$') {
                    *p++ = '\\';
                }
            }

            *p++ = ch;
        }

        text->len = p - data;
        text->data = data;

        return NGX_OK;
    }

    if (ngx_array_init(&lengths, r->pool, 8, sizeof(size_t *)) != NGX_OK) {
        return NGX_ERROR;
    }

    if (ngx_array_init(&values, r->pool, 8, sizeof(u_char *)) != NGX_OK) {
        return NGX_ERROR;
    }

    len = 0;
    i = 0;

    while (i < text->len) {

        if (text->data[i] == '$') {

            var.len = 0;

            if (++i == text->len) {
                goto invalid_variable;
            }

            if (text->data[i] == '{') {
                bracket = 1;

                if (++i == text->len) {
                    goto invalid_variable;
                }

                var.data = &text->data[i];

            } else {
                bracket = 0;
                var.data = &text->data[i];
            }

            for ( /* void */ ; i < text->len; i++, var.len++) {
                ch = text->data[i];

                if (ch == '}' && bracket) {
                    i++;
                    bracket = 0;
                    break;
                }

                if ((ch >= 'A' && ch <= 'Z')
                    || (ch >= 'a' && ch <= 'z')
                    || (ch >= '0' && ch <= '9')
                    || ch == '_')
                {
                    continue;
                }

                break;
            }

            if (bracket) {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "the closing bracket in \"%V\" "
                              "variable is missing", &var);
                return NGX_HTTP_SSI_ERROR;
            }

            if (var.len == 0) {
                goto invalid_variable;
            }

            key = ngx_hash_strlow(var.data, var.data, var.len);

            val = ngx_http_ssi_get_variable(r, &var, key);

            if (val == NULL) {
                vv = ngx_http_get_variable(r, &var, key);
                if (vv == NULL) {
                    return NGX_ERROR;
                }

                if (vv->not_found) {
                    continue;
                }

                part_data = vv->data;
                part_len = vv->len;

            } else {
                part_data = val->data;
                part_len = val->len;
            }

        } else {
            part_data = &text->data[i];
            quoted = 0;

            for (p = part_data; i < text->len; i++) {
                ch = text->data[i];

                if (!quoted) {

                    if (ch == '\\') {
                        quoted = 1;
                        continue;
                    }

                    if (ch == '$') {
                        break;
                    }

                } else {
                    quoted = 0;

                    if (ch != '\\' && ch != '\'' && ch != '"' && ch != '$') {
                        *p++ = '\\';
                    }
                }

                *p++ = ch;
            }

            part_len = p - part_data;
        }

        len += part_len;

        size = ngx_array_push(&lengths);
        if (size == NULL) {
            return NGX_ERROR;
        }

        *size = part_len;

        value = ngx_array_push(&values);
        if (value == NULL) {
            return NGX_ERROR;
        }

        *value = part_data;
    }

    prefix = 0;

    size = lengths.elts;
    value = values.elts;

    if (flags & NGX_HTTP_SSI_ADD_PREFIX) {
        for (i = 0; i < values.nelts; i++) {
            if (size[i] != 0) {
                if (*value[i] != '/') {
                    for (prefix = r->uri.len; prefix; prefix--) {
                        if (r->uri.data[prefix - 1] == '/') {
                            len += prefix;
                            break;
                        }
                    }
                }

                break;
            }
        }
    }

    p = ngx_pnalloc(r->pool, len + ((flags & NGX_HTTP_SSI_ADD_ZERO) ? 1 : 0));
    if (p == NULL) {
        return NGX_ERROR;
    }

    text->len = len;
    text->data = p;

    p = ngx_copy(p, r->uri.data, prefix);

    for (i = 0; i < values.nelts; i++) {
        p = ngx_copy(p, value[i], size[i]);
    }

    return NGX_OK;

invalid_variable:

    ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                  "invalid variable name in \"%V\"", text);

    return NGX_HTTP_SSI_ERROR;
}